

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_preprocessAndSolveReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool applySimplifier,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  double dVar1;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  Settings *pSVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Result simplificationStatus;
  long lVar4;
  byte bVar5;
  undefined7 in_register_00000031;
  cpp_dec_float<200u,int,void> *pcVar6;
  uint *puVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_02;
  long in_FS_OFFSET;
  bool bVar10;
  byte bVar11;
  double extraout_XMM0_Qa;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b8;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar11 = 0;
  this_02 = &(this->_solver).
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .offset;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)this_02,this->_currentSettings->_realParamValues[0x17])
  ;
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  this->_applyPolishing = false;
  if ((int)CONCAT71(in_register_00000031,applySimplifier) == 0) {
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    if (this->_isRealLPScaled == false) {
      this->_scaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
    }
LAB_005d279d:
    if (this->_scaler ==
        (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      bVar5 = 0;
    }
    else {
      bVar5 = this->_isRealLPScaled ^ 1;
    }
  }
  else {
    _enableSimplifierAndScaler(this);
    bVar5 = 1;
    if (this->_simplifier ==
        (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) goto LAB_005d279d;
  }
  if ((this->_solver).useTerminationValue == true) {
    local_1c0 = 0x1c00000000;
    local_238 = 0;
    uStack_230 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1cb = 0;
    iStack_1c8 = 0;
    bStack_1c4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_238,
               this->_currentSettings->_realParamValues
               [(ulong)(this->_currentSettings->_intParamValues[0] == -1) + 8]);
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_238;
    pnVar9 = &(this->_solver).objLimit;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(uint *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + (ulong)bVar11 * -8 + 4);
    }
    (this->_solver).objLimit.m_backend.exp = iStack_1c8;
    (this->_solver).objLimit.m_backend.neg = bStack_1c4;
    (this->_solver).objLimit.m_backend.fpclass = (undefined4)local_1c0;
    (this->_solver).objLimit.m_backend.prec_elem = local_1c0._4_4_;
  }
  else {
    ::soplex::infinity::__tls_init();
    local_240 = 0x1c00000000;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    iStack_248 = 0;
    bStack_244 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2b8,*(double *)(in_FS_OFFSET + -8));
    pcVar6 = (cpp_dec_float<200u,int,void> *)&local_2b8;
    pnVar9 = &(this->_solver).objLimit;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *(uint *)pcVar6;
      pcVar6 = pcVar6 + (ulong)bVar11 * -8 + 4;
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + (ulong)bVar11 * -8 + 4);
    }
    (this->_solver).objLimit.m_backend.exp = iStack_248;
    (this->_solver).objLimit.m_backend.neg = bStack_244;
    (this->_solver).objLimit.m_backend.fpclass = (undefined4)local_240;
    (this->_solver).objLimit.m_backend.prec_elem = local_240._4_4_;
    (this->_solver).useTerminationValue = true;
  }
  this_00 = &this->_solver;
  if (this->_isRealLPLoaded == true) {
    if (bVar5 == 0) goto LAB_005d29ce;
    this->_realLP =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->_realLP,1);
    this_01 = this->_realLP;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(this_01,&this_00->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    this->_realLP = this_01;
    bVar10 = false;
  }
  else {
    if (this->_hasBasis == true) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_00,this->_realLP,false);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasis(this_00,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    }
    else {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_00,this->_realLP,true);
    }
    if (bVar5 != 0) goto LAB_005d29ce;
    (**(this->_realLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._vptr_ClassArray)();
    free(this->_realLP);
    this->_realLP =
         &this_00->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    bVar10 = true;
  }
  this->_isRealLPLoaded = bVar10;
LAB_005d29ce:
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    simplificationStatus = OKAY;
  }
  else {
    pSVar2 = this->_currentSettings;
    bVar10 = pSVar2->_intParamValues[0xe] == 3;
    if ((pSVar2->_intParamValues[1] == 2) ||
       ((pSVar2->_intParamValues[1] == 0 &&
        ((double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1) * pSVar2->_realParamValues[0x10] <
         (double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1))))) {
      bVar10 = (bool)(pSVar2->_intParamValues[0xe] == 3 & pSVar2->_boolParamValues[8]);
    }
    dVar1 = (this->_solver).maxTime;
    (*((this->_solver).theTime)->_vptr_Timer[6])();
    simplificationStatus =
         (*this->_simplifier->_vptr_SPxSimplifier[5])
                   (dVar1 - extraout_XMM0_Qa,this->_simplifier,this_00,(ulong)bVar10,
                    (ulong)(this->_solver).random.seedshift);
    (*this->_simplifier->_vptr_SPxSimplifier[0x10])(local_130);
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1b8,
               this->_currentSettings->_realParamValues[0x17]);
    puVar7 = local_130;
    pcVar8 = &local_b0;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pcVar8->data)._M_elems[0] = *puVar7;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
    }
    local_b0.exp = local_c0;
    local_b0.neg = (bool)local_bc;
    local_b0.fpclass = local_b8;
    local_b0.prec_elem = iStack_b4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&local_b0,&local_1b8);
    pcVar8 = &local_b0;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (this_02->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
      this_02 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)this_02 + (ulong)bVar11 * -8 + 4);
    }
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.exp = local_b0.exp;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.neg = local_b0.neg;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.fpclass = local_b0.fpclass;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.prec_elem = local_b0.prec_elem;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ._isScaled = false;
    this->_applyPolishing = true;
    (this->_solver).polishObj = POLISH_OFF;
  }
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (simplificationStatus == OKAY) {
    pSVar3 = this->_scaler;
    if ((pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       ((this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._isScaled == false)) {
      (*pSVar3->_vptr_SPxScaler[0xd])(pSVar3,this_00,0);
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidate(&(this->_solver).
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x77])(this_00);
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this_00);
    }
    _solveRealLPAndRecordStatistics(this,interrupt);
    simplificationStatus = OKAY;
  }
  _evaluateSolutionReal(this,simplificationStatus);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}